

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_ini_writer::open_section(xr_ini_writer *this,char *name)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"%s",&local_39);
  open_section(this,&local_38,name);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void xr_ini_writer::open_section(const char *name)
{
	open_section("%s", name);
}